

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

int __thiscall FBehavior::FindStringInChunk(FBehavior *this,DWORD *names,char *varname)

{
  uint uVar1;
  int iVar2;
  DWORD i;
  ulong uVar3;
  
  if (names != (DWORD *)0x0) {
    uVar1 = names[2];
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      iVar2 = strcasecmp(varname,(char *)((long)names + (ulong)names[(int)uVar3 + 3] + 8));
      if (iVar2 == 0) {
        return (int)uVar3;
      }
    }
  }
  return -1;
}

Assistant:

int FBehavior::FindStringInChunk (DWORD *names, const char *varname) const
{
	if (names != NULL)
	{
		DWORD i;

		for (i = 0; i < LittleLong(names[2]); ++i)
		{
			if (stricmp (varname, (char *)(names + 2) + LittleLong(names[3+i])) == 0)
			{
				return (int)i;
			}
		}
	}
	return -1;
}